

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderCodeVariableDescX::~ShaderCodeVariableDescX(ShaderCodeVariableDescX *this)

{
  ShaderCodeVariableDescX *this_local;
  
  std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ::~vector(&this->Members);
  std::__cxx11::string::~string((string *)&this->TypeNameCopy);
  std::__cxx11::string::~string((string *)&this->NameCopy);
  return;
}

Assistant:

ShaderCodeVariableDescX() noexcept {}